

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O2

void __thiscall duckdb::JoinFilterLocalState::~JoinFilterLocalState(JoinFilterLocalState *this)

{
  _Tuple_impl<0UL,_duckdb::LocalUngroupedAggregateState_*,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
  __ptr;
  
  __ptr.super__Head_base<0UL,_duckdb::LocalUngroupedAggregateState_*,_false>._M_head_impl =
       (this->local_aggregate_state).
       super_unique_ptr<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LocalUngroupedAggregateState_*,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
       .super__Head_base<0UL,_duckdb::LocalUngroupedAggregateState_*,_false>;
  if (__ptr.super__Head_base<0UL,_duckdb::LocalUngroupedAggregateState_*,_false>._M_head_impl !=
      (LocalUngroupedAggregateState *)0x0) {
    ::std::default_delete<duckdb::LocalUngroupedAggregateState>::operator()
              ((default_delete<duckdb::LocalUngroupedAggregateState> *)this,
               (LocalUngroupedAggregateState *)
               __ptr.super__Head_base<0UL,_duckdb::LocalUngroupedAggregateState_*,_false>.
               _M_head_impl);
  }
  (this->local_aggregate_state).
  super_unique_ptr<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LocalUngroupedAggregateState_*,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
  .super__Head_base<0UL,_duckdb::LocalUngroupedAggregateState_*,_false> =
       (_Head_base<0UL,_duckdb::LocalUngroupedAggregateState_*,_false>)0x0;
  return;
}

Assistant:

unique_ptr<JoinFilterGlobalState> JoinFilterPushdownInfo::GetGlobalState(ClientContext &context,
                                                                         const PhysicalOperator &op) const {
	// clear any previously set filters
	// we can have previous filters for this operator in case of e.g. recursive CTEs
	for (auto &info : probe_info) {
		info.dynamic_filters->ClearFilters(op);
	}
	auto result = make_uniq<JoinFilterGlobalState>();
	result->global_aggregate_state =
	    make_uniq<GlobalUngroupedAggregateState>(BufferAllocator::Get(context), min_max_aggregates);
	return result;
}